

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalSamePower(WSNTopologyBasedEnergy *this)

{
  WSNNode *this_00;
  int iVar1;
  pointer piVar2;
  WSNNode *pWVar3;
  WSNTopologyBasedEnergy *pWVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> _array;
  allocator<char> local_159;
  _InputArray local_158;
  WSNNode *local_140;
  WSNNode *local_138;
  WSNNode *local_130;
  WSNNode *local_128;
  WSNNode *local_120;
  _Vector_base<int,_std::allocator<int>_> local_118;
  string local_100 [32];
  undefined1 local_e0 [88];
  WSNNode local_88;
  
  SelectServalNode((vector<int,_std::allocator<int>_> *)&local_118,this);
  local_130 = this->LayerLeaderNode + 2;
  local_128 = this->LayerLeaderNode + 1;
  local_120 = this->LayerLeaderNode;
  local_140 = this->LayerLeaderNode + 4;
  local_138 = this->LayerLeaderNode + 3;
  for (piVar2 = local_118._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_118._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    SelectLeaderID(this);
    iVar1 = WSNNode::layer(this->node + *piVar2);
    pWVar3 = local_120;
    if (iVar1 != 0) {
      iVar1 = WSNNode::layer(this->node + *piVar2);
      pWVar3 = local_128;
      if (iVar1 != 1) {
        iVar1 = WSNNode::layer(this->node + *piVar2);
        pWVar3 = local_130;
        if (iVar1 != 2) {
          iVar1 = WSNNode::layer(this->node + *piVar2);
          pWVar3 = local_138;
          if (iVar1 != 3) {
            pWVar3 = local_140;
          }
        }
      }
    }
    iVar1 = WSNNode::GetNodeID(pWVar3);
    this->node[iVar1].energy = this->node[iVar1].energy + -10.0;
    iVar1 = *piVar2;
    this->node[iVar1].energy = this->node[iVar1].energy + -7.0;
    WSNNode::WSNNode(&local_88,this->node + iVar1);
    pWVar4 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
    WSNNode::NodeColor((Scalar *)&stack0xffffffffffffffb0,this->node + *piVar2);
    drawCrossNode(pWVar4,&this->img,&local_88,(Scalar *)&stack0xffffffffffffffb0);
    WSNNode::~WSNNode(&local_88);
    std::__cxx11::string::string<std::allocator<char>>(local_100,"WSN",&local_159);
    local_158.sz.width = 0;
    local_158.sz.height = 0;
    local_158.flags = 0x1010000;
    local_158.obj = this;
    cv::imshow(local_100,&local_158);
    std::__cxx11::string::~string(local_100);
  }
  pWVar3 = (WSNNode *)(local_e0 + 0x20);
  for (lVar5 = 0x18e8; lVar5 != 0x1a00; lVar5 = lVar5 + 0x38) {
    this_00 = (WSNNode *)((long)(&(this->sink).color + -4) + lVar5);
    iVar1 = WSNNode::GetNodeID(this_00);
    WSNNode::WSNNode(pWVar3,this->node + iVar1);
    iVar1 = WSNNode::GetNodeID(this_00);
    pWVar4 = (WSNTopologyBasedEnergy *)local_e0;
    WSNNode::NodeColor((Scalar *)pWVar4,this->node + iVar1);
    drawCrossNode(pWVar4,&this->img,pWVar3,(Scalar *)local_e0);
    WSNNode::~WSNNode(pWVar3);
    std::__cxx11::string::string<std::allocator<char>>(local_100,"WSN",&local_159);
    local_158.sz.width = 0;
    local_158.sz.height = 0;
    local_158.flags = 0x1010000;
    local_158.obj = this;
    cv::imshow(local_100,&local_158);
    std::__cxx11::string::~string(local_100);
  }
  if (this->Test != false) {
    cv::waitKey(400);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_118);
  return;
}

Assistant:

void WSNTopologyBasedEnergy::NodeSentSignalSamePower()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		//选择每层的leader节点
		SelectLeaderID();

		//计算能量变化值
		if(0==node[*it].layer())
		{
			//LayerLeaderNode[0].energy-=1+alpha * DistanceBetweenNodes(LayerLeaderNode[0],Link);
			node[LayerLeaderNode[0].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(1==node[*it].layer())
		{
			//LayerLeaderNode[1].energy-=5;
			node[LayerLeaderNode[1].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(2==node[*it].layer())
		{
			//LayerLeaderNode[2].energy-=5;
			node[LayerLeaderNode[2].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		else if(3==node[*it].layer())
		{
			//LayerLeaderNode[3].energy-=5;
			node[LayerLeaderNode[3].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else 
		{
			//LayerLeaderNode[4].energy-=5;
			node[LayerLeaderNode[4].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<LayerNum;i++)
	{
		drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}